

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_get_bits(stbi__jpeg *j,int n)

{
  uint uVar1;
  uint k;
  int n_local;
  stbi__jpeg *j_local;
  
  if (j->code_bits < n) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->code_bits < n) {
    j_local._4_4_ = 0;
  }
  else {
    uVar1 = j->code_buffer << ((byte)n & 0x1f) | j->code_buffer >> (-(byte)n & 0x1f);
    j->code_buffer = uVar1 & (stbi__bmask[n] ^ 0xffffffff);
    j_local._4_4_ = stbi__bmask[n] & uVar1;
    j->code_bits = j->code_bits - n;
  }
  return j_local._4_4_;
}

Assistant:

stbi_inline static int stbi__jpeg_get_bits(stbi__jpeg *j, int n)
{
   unsigned int k;
   if (j->code_bits < n) stbi__grow_buffer_unsafe(j);
   if (j->code_bits < n) return 0; // ran out of bits from stream, return 0s intead of continuing
   k = stbi_lrot(j->code_buffer, n);
   j->code_buffer = k & ~stbi__bmask[n];
   k &= stbi__bmask[n];
   j->code_bits -= n;
   return k;
}